

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialSort.cpp
# Opt level: O2

void __thiscall
Assimp::SpatialSort::SpatialSort
          (SpatialSort *this,aiVector3D *pPositions,uint pNumPositions,uint pElementOffset)

{
  (this->mPlaneNormal).x = 0.8523;
  (this->mPlaneNormal).y = 0.34321;
  (this->mPlaneNormal).z = 0.5736;
  (this->mPositions).
  super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPositions).
  super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPositions).
  super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aiVector3t<float>::Normalize(&this->mPlaneNormal);
  Fill(this,pPositions,pNumPositions,pElementOffset,true);
  return;
}

Assistant:

SpatialSort::SpatialSort( const aiVector3D* pPositions, unsigned int pNumPositions,
    unsigned int pElementOffset)

    // define the reference plane. We choose some arbitrary vector away from all basic axises
    // in the hope that no model spreads all its vertices along this plane.
    : mPlaneNormal(0.8523f, 0.34321f, 0.5736f)
{
    mPlaneNormal.Normalize();
    Fill(pPositions,pNumPositions,pElementOffset);
}